

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateRows(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  int *piVar1;
  undefined8 *puVar2;
  uint *puVar3;
  double a;
  char cVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  undefined8 uVar6;
  Tolerances *pTVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  DataKey *pDVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  DuplicateRowsPS *pDVar12;
  bool bVar13;
  undefined1 uVar14;
  bool bVar15;
  Result RVar16;
  Verbosity VVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  pointer pDVar23;
  Item *pIVar24;
  undefined1 (*pauVar25) [16];
  SPxOut *pSVar26;
  ulong uVar27;
  long *plVar28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  int *piVar33;
  long lVar34;
  pointer pnVar35;
  uint uVar36;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar37;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *dupRows;
  long lVar38;
  long lVar39;
  cpp_dec_float<50U,_int,_void> *pcVar40;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pDVar41;
  long in_FS_OFFSET;
  bool bVar42;
  Real RVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  Verbosity old_verbosity;
  undefined1 auStack_744 [12];
  int *local_738;
  uint uStack_730;
  undefined3 uStack_72b;
  uint local_728;
  undefined3 uStack_723;
  int local_720;
  bool local_71c;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_718;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_710;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  int *perm_tmp;
  int *perm;
  int *piStack_6c0;
  int *local_6b8;
  uint uStack_6b0;
  undefined3 uStack_6ab;
  uint local_6a8;
  undefined3 uStack_6a3;
  int local_6a0;
  bool local_69c;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_698;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_668;
  undefined8 uStack_660;
  undefined1 local_658 [8];
  int *piStack_650;
  int *local_648;
  uint uStack_640;
  undefined3 uStack_63b;
  uint local_638;
  undefined3 uStack_633;
  int local_630;
  bool local_62c;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_628;
  Item *local_620;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_618;
  undefined8 uStack_610;
  DuplicateRowsPS *local_600;
  ulong local_5f8;
  long local_5f0;
  ulong local_5e8;
  int *idxMem;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  int *local_578;
  int *piStack_570;
  int *local_568;
  int *piStack_560;
  int *local_558;
  int local_550;
  bool local_54c;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_548;
  int *local_538;
  int *piStack_530;
  int *local_528;
  int *piStack_520;
  int *local_518;
  int local_510;
  bool local_50c;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_508;
  DataArray<int> local_500;
  uint local_4e8;
  uint local_4e4;
  bool *local_4e0;
  Real local_4d8;
  Item *local_4d0;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  Item *local_4a8;
  DataArray<bool> local_498;
  DataArray<bool> local_480;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  int *local_448;
  int *piStack_440;
  int *local_438;
  uint auStack_430 [2];
  uint local_428 [2];
  int local_420;
  bool local_41c;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_418;
  int local_410;
  int local_40c;
  int *local_408;
  undefined8 local_400;
  cpp_dec_float<50U,_int,_void> local_3f8;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_3b8;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_3b0;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_398;
  shared_ptr<soplex::Tolerances> local_380;
  shared_ptr<soplex::Tolerances> local_370;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newRhsVec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newLhsVec;
  int *local_328;
  undefined8 local_320;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_318;
  undefined8 uStack_310;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_308;
  undefined8 uStack_300;
  bool *local_2f0;
  long local_2e8;
  DataArray<int> local_2e0;
  DataArray<int> local_2c8;
  int local_2b0;
  int local_2ac;
  bool *local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  uint auStack_290 [4];
  undefined5 uStack_280;
  undefined3 uStack_27b;
  undefined8 local_278;
  int local_270;
  undefined1 local_26c;
  undefined8 local_268;
  undefined1 local_258 [16];
  int *local_248;
  uint uStack_240;
  undefined3 uStack_23b;
  undefined8 local_238;
  int local_230;
  char local_22c;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_228;
  int *local_218;
  int *piStack_210;
  int *local_208;
  int *piStack_200;
  int *local_1f8;
  int *local_1e8;
  int *piStack_1e0;
  int *local_1d8;
  int *piStack_1d0;
  int *local_1c8;
  int *local_1b8;
  int *piStack_1b0;
  int *local_1a8;
  int *piStack_1a0;
  int *local_198;
  int *local_188;
  int *piStack_180;
  int *local_178;
  int *piStack_170;
  int *local_168;
  int *local_158;
  int *piStack_150;
  int *local_148;
  int *piStack_140;
  int *local_138;
  int *local_128;
  int *piStack_120;
  int *local_118;
  int *piStack_110;
  int *local_108;
  uint local_f8 [2];
  uint auStack_f0 [2];
  uint local_e8 [2];
  undefined8 uStack_e0;
  undefined8 local_d8;
  int *local_c8;
  int *piStack_c0;
  int *local_b8;
  undefined8 uStack_b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_2e8 = (long)(lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
  local_2f0 = again;
  RVar16 = removeEmpty(this,lp);
  if (RVar16 == OKAY) {
    auVar11._12_4_ = 0;
    auVar11._0_12_ = auStack_744;
    _old_verbosity = auVar11 << 0x20;
    local_410 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
    if (local_410 < 1) {
      RVar16 = OKAY;
    }
    else {
      iVar30 = 0;
      VVar17 = ERROR;
      do {
        pIVar24 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem;
        iVar18 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[(int)VVar17].idx;
        if (pIVar24[iVar18].data.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused == 1) {
          removeRowSingleton(this,lp,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)(pIVar24 + iVar18),(int *)&old_verbosity);
          iVar30 = iVar30 + 1;
          local_410 = (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum;
          VVar17 = old_verbosity;
        }
        VVar17 = VVar17 + WARNING;
        old_verbosity = VVar17;
      } while ((int)VVar17 < local_410);
      if (((0 < iVar30) &&
          (pSVar26 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).spxout, pSVar26 != (SPxOut *)0x0)) && (3 < (int)pSVar26->m_verbosity)) {
        old_verbosity = pSVar26->m_verbosity;
        result_2.m_backend.data._M_elems[0] = 4;
        (*pSVar26->_vptr_SPxOut[2])();
        pSVar26 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar26->m_streams[pSVar26->m_verbosity],
                   "Simplifier duplicate rows (row singleton stage) removed ",0x38);
        std::ostream::operator<<((ostream *)pSVar26->m_streams[pSVar26->m_verbosity],iVar30);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar26->m_streams[pSVar26->m_verbosity]," rows, ",7);
        std::ostream::operator<<((ostream *)pSVar26->m_streams[pSVar26->m_verbosity],iVar30);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar26->m_streams[pSVar26->m_verbosity]," non-zeros",10);
        cVar4 = (char)pSVar26->m_streams[pSVar26->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar26->m_streams[pSVar26->m_verbosity] + -0x18) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        pSVar26 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        (*pSVar26->_vptr_SPxOut[2])(pSVar26,&old_verbosity);
        local_410 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
      }
      RVar16 = OKAY;
      if (1 < local_410) {
        local_408 = (int *)0x0;
        local_400 = 0x3ff3333333333333;
        local_40c = local_410;
        spx_alloc<int*>(&local_408,local_410);
        iVar30 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        local_328 = (int *)0x0;
        local_320 = 0x3ff3333333333333;
        iVar18 = 0;
        if (0 < iVar30) {
          iVar18 = iVar30;
        }
        iVar21 = 1;
        if (0 < iVar30) {
          iVar21 = iVar18;
        }
        spx_alloc<int*>(&local_328,iVar21);
        Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::Array(&scale,(lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
        idxMem = (int *)0x0;
        spx_alloc<int*>(&idxMem,(lp->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum);
        piVar33 = idxMem;
        *local_408 = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)
                   scale.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,0.0);
        uVar36 = local_678._4_4_;
        iVar30 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        *local_328 = iVar30;
        local_678 = (double)((ulong)local_678._4_4_ << 0x20);
        if (1 < iVar30) {
          lVar31 = 1;
          local_678 = (double)((ulong)uVar36 << 0x20);
          lVar39 = 0x38;
          do {
            local_408[lVar31] = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)
                       ((long)((scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar39),0.0);
            local_328[lVar31] = 0;
            piVar33[lVar31 + -1] = (int)lVar31;
            lVar31 = lVar31 + 1;
            local_678 = (double)CONCAT44(local_678._4_4_,(int)local_678 + 1);
            lVar39 = lVar39 + 0x38;
          } while (lVar31 < (lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        local_268._0_4_ = cpp_dec_float_finite;
        local_268._4_4_ = 10;
        local_298._0_4_ = 0;
        local_298._4_4_ = 0;
        auStack_290[0] = 0;
        auStack_290[1] = 0;
        auStack_290[2] = 0;
        auStack_290[3] = 0;
        uStack_280 = 0;
        uStack_27b = 0;
        local_278 = 0;
        local_270 = 0;
        local_26c = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_298,0.0);
        local_710 = this;
        if (0 < (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          lVar31 = 0;
          do {
            pIVar24 = (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.theitem;
            iVar30 = (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[lVar31].idx;
            local_5f0 = lVar31;
            if (0 < pIVar24[iVar30].data.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
              local_620 = pIVar24 + iVar30;
              lVar31 = 0;
              pDVar41 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x0;
              do {
                pnVar35 = scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pNVar5 = (local_620->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem;
                uVar6 = *(undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar31 + 0x20)
                ;
                result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
                result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
                result_2.m_backend.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])((long)(pNVar5->val).m_backend.data._M_elems + lVar31);
                puVar3 = (uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar31 + 0x10);
                result_2.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
                uVar6 = *(undefined8 *)(puVar3 + 2);
                result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
                result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
                result_2.m_backend.exp =
                     *(int *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar31);
                result_2.m_backend.neg =
                     *(bool *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar31 + 4);
                result_2.m_backend._48_8_ =
                     *(undefined8 *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar31 + 8);
                iVar30 = *(int *)((long)(&((local_620->data).
                                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .m_elem)->val + 1) + lVar31);
                local_668 = pDVar41;
                if (scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.fpclass !=
                    cpp_dec_float_NaN) {
                  local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0xa00000000;
                  _old_verbosity = (undefined1  [16])0x0;
                  local_738 = (int *)0x0;
                  _uStack_730 = 0;
                  uStack_72b = 0;
                  _local_728 = 0;
                  uStack_723 = 0;
                  local_720 = 0;
                  local_71c = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&old_verbosity,0.0);
                  iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&pnVar35[iVar30].m_backend,
                                      (cpp_dec_float<50U,_int,_void> *)&old_verbosity);
                  if (iVar18 == 0) {
                    *(ulong *)(scale.data.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.data.
                               _M_elems + 8) =
                         CONCAT35(result_2.m_backend.data._M_elems[9]._1_3_,
                                  result_2.m_backend.data._M_elems._32_5_);
                    puVar3 = scale.data.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.data.
                             _M_elems + 4;
                    *(undefined8 *)puVar3 = result_2.m_backend.data._M_elems._16_8_;
                    *(ulong *)(puVar3 + 2) =
                         CONCAT35(result_2.m_backend.data._M_elems[7]._1_3_,
                                  result_2.m_backend.data._M_elems._24_5_);
                    *(undefined8 *)
                     scale.data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.data._M_elems =
                         result_2.m_backend.data._M_elems._0_8_;
                    *(undefined8 *)
                     (scale.data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.data._M_elems + 2)
                         = result_2.m_backend.data._M_elems._8_8_;
                    scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.exp =
                         result_2.m_backend.exp;
                    scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.neg =
                         result_2.m_backend.neg;
                    scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.fpclass =
                         result_2.m_backend.fpclass;
                    scale.data.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend.prec_elem =
                         result_2.m_backend.prec_elem;
                  }
                }
                iVar18 = local_408[iVar30];
                pDVar23 = (local_710->m_classSetRows).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0xa00000000;
                _old_verbosity = (undefined1  [16])0x0;
                local_738 = (int *)0x0;
                _uStack_730 = 0;
                uStack_72b = 0;
                _local_728 = 0;
                uStack_723 = 0;
                local_720 = 0;
                local_71c = false;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&result_2.m_backend,
                           &scale.data.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar30].m_backend);
                DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add(pDVar23 + iVar18,iVar30,
                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&old_verbosity);
                piVar1 = local_328 + local_408[iVar30];
                *piVar1 = *piVar1 + -1;
                if (*piVar1 == 0) {
                  lVar39 = (long)(int)local_678;
                  local_678 = (double)CONCAT44(local_678._4_4_,(int)local_678 + 1);
                  piVar33[lVar39] = local_408[iVar30];
                }
                pDVar41 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)((long)&local_668->_vptr_DSVectorBase + 1);
                iVar30 = (local_620->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
                uVar27 = (ulong)iVar30;
                lVar31 = lVar31 + 0x3c;
              } while ((long)pDVar41 < (long)uVar27);
              this = local_710;
              if (0 < iVar30) {
                pDVar23 = (local_710->m_classSetRows).data.
                          super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar32 = 0;
                pIVar24 = local_620;
                do {
                  pDVar41 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((long)local_408[(pIVar24->data).
                                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                .m_elem[uVar32].idx] * 0x20);
                  if (0 < *(int *)((long)&(pDVar41->
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).memused + (long)pDVar23)) {
                    pTVar7 = (this->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    p_Var8 = (this->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                      }
                    }
                    RVar43 = Tolerances::epsilon(pTVar7);
                    local_228 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0xa00000000;
                    local_258 = (undefined1  [16])0x0;
                    local_248 = (int *)0x0;
                    _uStack_240 = 0;
                    uStack_23b = 0;
                    local_238 = 0;
                    local_230 = 0;
                    local_22c = '\0';
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)local_258,RVar43);
                    _local_638 = (undefined5)local_238;
                    uStack_633 = (undefined3)((ulong)local_238 >> 0x28);
                    local_648 = local_248;
                    _uStack_640 = _uStack_240;
                    uStack_63b = uStack_23b;
                    local_658 = (undefined1  [8])local_258._0_8_;
                    piStack_650 = (int *)local_258._8_8_;
                    local_630 = local_230;
                    local_62c = (bool)local_22c;
                    local_628 = local_228;
                    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
                    }
                    pDVar23 = (this->m_classSetRows).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    iVar30 = *(int *)((long)&(pDVar41->
                                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             ).memused + (long)pDVar23);
                    if (1 < iVar30) {
                      SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                                (*(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   **)((long)&(pDVar41->
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              ).m_elem + (long)pDVar23),iVar30,
                                 (ElementCompare *)local_658,0,true);
                      pDVar23 = (this->m_classSetRows).data.
                                super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    }
                    iVar30 = *piVar33;
                    lVar31 = (long)(int)local_678;
                    local_678 = (double)CONCAT44(local_678._4_4_,(int)local_678 + -1);
                    *piVar33 = piVar33[lVar31 + -1];
                    local_5e8 = uVar32;
                    if (0 < *(int *)((long)&(pDVar41->
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).memused + (long)pDVar23)) {
                      plVar28 = (long *)((long)&(pDVar41->
                                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                ).m_elem + (long)pDVar23);
                      lVar39 = 0;
                      lVar31 = 0;
                      local_688 = pDVar41;
                      do {
                        uVar14 = local_26c;
                        iVar18 = local_270;
                        if (lVar39 != 0) {
                          lVar22 = *plVar28;
                          pnVar29 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      **)(lVar22 + 0x20 + lVar39);
                          local_c8 = *(int **)(lVar22 + lVar39);
                          piStack_c0 = (int *)((undefined8 *)(lVar22 + lVar39))[1];
                          puVar2 = (undefined8 *)(lVar22 + 0x10 + lVar39);
                          local_b8 = (int *)*puVar2;
                          uStack_b0 = puVar2[1];
                          iVar21 = *(int *)(lVar22 + 0x28 + lVar39);
                          cVar4 = *(char *)(lVar22 + 0x2c + lVar39);
                          local_668 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        **)(lVar22 + 0x30 + lVar39);
                          uStack_660 = 0;
                          local_d8 = local_278;
                          uStack_e0 = CONCAT35(uStack_27b,uStack_280);
                          local_e8[0] = auStack_290[2];
                          local_e8[1] = auStack_290[3];
                          local_f8[0] = (uint)local_298;
                          local_f8[1] = local_298._4_4_;
                          auStack_f0[0] = auStack_290[0];
                          auStack_f0[1] = auStack_290[1];
                          local_618 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)local_268;
                          uStack_610 = 0;
                          local_a8 = pnVar29;
                          epsZero((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_68,this);
                          perm = local_c8;
                          piStack_6c0 = piStack_c0;
                          local_6b8 = local_b8;
                          _uStack_6b0 = (undefined5)uStack_b0;
                          uStack_6ab = (undefined3)((ulong)uStack_b0 >> 0x28);
                          _local_6a8 = SUB85(local_a8,0);
                          uStack_6a3 = (undefined3)((ulong)local_a8 >> 0x28);
                          local_698 = local_668;
                          factor.m_backend.data._M_elems[0] = local_f8[0];
                          factor.m_backend.data._M_elems[1] = local_f8[1];
                          factor.m_backend.data._M_elems[2] = auStack_f0[0];
                          factor.m_backend.data._M_elems[3] = auStack_f0[1];
                          factor.m_backend.data._M_elems[4] = local_e8[0];
                          factor.m_backend.data._M_elems[5] = local_e8[1];
                          factor.m_backend.data._M_elems._24_5_ = SUB85(uStack_e0,0);
                          factor.m_backend.data._M_elems[7]._1_3_ =
                               (undefined3)((ulong)uStack_e0 >> 0x28);
                          factor.m_backend.data._M_elems._32_5_ = SUB85(local_d8,0);
                          factor.m_backend.data._M_elems[9]._1_3_ =
                               (undefined3)((ulong)local_d8 >> 0x28);
                          factor.m_backend.exp = iVar18;
                          factor.m_backend.neg = (bool)uVar14;
                          factor.m_backend._48_8_ = local_618;
                          local_6a0 = iVar21;
                          local_69c = (bool)cVar4;
                          relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                                    (&result_2,(soplex *)&perm,&factor,pnVar29);
                          _local_728 = result_2.m_backend.data._M_elems._32_5_;
                          uStack_723 = result_2.m_backend.data._M_elems[9]._1_3_;
                          local_738 = (int *)result_2.m_backend.data._M_elems._16_8_;
                          _uStack_730 = result_2.m_backend.data._M_elems._24_5_;
                          uStack_72b = result_2.m_backend.data._M_elems[7]._1_3_;
                          old_verbosity = result_2.m_backend.data._M_elems[0];
                          auStack_744._0_4_ = result_2.m_backend.data._M_elems[1];
                          auStack_744._4_4_ = result_2.m_backend.data._M_elems[2];
                          auStack_744._8_4_ = result_2.m_backend.data._M_elems[3];
                          auVar11 = _old_verbosity;
                          local_720 = result_2.m_backend.exp;
                          local_71c = result_2.m_backend.neg;
                          local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)result_2.m_backend._48_8_;
                          if ((result_2.m_backend.neg == true) &&
                             (old_verbosity = result_2.m_backend.data._M_elems[0],
                             old_verbosity != ERROR ||
                             result_2.m_backend.fpclass != cpp_dec_float_finite)) {
                            local_71c = false;
                          }
                          this = local_710;
                          pDVar41 = local_688;
                          _old_verbosity = auVar11;
                          if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                              (local_68.fpclass != cpp_dec_float_NaN)) &&
                             (iVar18 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare
                                                 ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,
                                                  &local_68), this = local_710, pDVar41 = local_688,
                             0 < iVar18)) {
                            iVar30 = *piVar33;
                            lVar22 = (long)(int)local_678;
                            local_678 = (double)CONCAT44(local_678._4_4_,(int)local_678 + -1);
                            *piVar33 = piVar33[lVar22 + -1];
                          }
                        }
                        pDVar23 = (this->m_classSetRows).data.
                                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        plVar28 = (long *)((long)&(pDVar41->
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).m_elem + (long)pDVar23);
                        lVar22 = *plVar28;
                        local_408[*(int *)(lVar22 + 0x38 + lVar39)] = iVar30;
                        local_328[iVar30] = local_328[iVar30] + 1;
                        local_278 = *(undefined8 *)(lVar22 + 0x20 + lVar39);
                        local_298 = *(undefined8 *)(lVar22 + lVar39);
                        auStack_290._0_8_ = *(undefined8 *)((uint *)(lVar22 + lVar39) + 2);
                        puVar3 = (uint *)(lVar22 + 0x10 + lVar39);
                        auStack_290._8_8_ = *(undefined8 *)puVar3;
                        uVar6 = *(undefined8 *)(puVar3 + 2);
                        uStack_280 = (undefined5)uVar6;
                        uStack_27b = (undefined3)((ulong)uVar6 >> 0x28);
                        local_270 = *(int *)(lVar22 + 0x28 + lVar39);
                        local_26c = *(undefined1 *)(lVar22 + 0x2c + lVar39);
                        local_268 = *(undefined8 *)(lVar22 + 0x30 + lVar39);
                        lVar31 = lVar31 + 1;
                        lVar39 = lVar39 + 0x3c;
                      } while (lVar31 < *(int *)((long)&(pDVar41->
                                                                                                                
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).memused + (long)pDVar23));
                    }
                    *(undefined4 *)
                     ((long)&(pDVar41->
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).memused + (long)pDVar23) = 0;
                    uVar27 = (ulong)(uint)(local_620->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .memused;
                    uVar32 = local_5e8;
                    pIVar24 = local_620;
                  }
                  uVar32 = uVar32 + 1;
                } while ((long)uVar32 < (long)(int)uVar27);
              }
            }
            lVar31 = local_5f0 + 1;
          } while (lVar31 < (lp->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        free(idxMem);
        idxMem = (int *)0x0;
        iVar30 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        local_2a8 = (bool *)0x0;
        local_2a0 = 0x3ff3333333333333;
        local_2b0 = 0;
        if (0 < iVar30) {
          local_2b0 = iVar30;
        }
        local_2ac = 1;
        if (0 < iVar30) {
          local_2ac = local_2b0;
        }
        spx_alloc<bool*>(&local_2a8,local_2ac);
        auVar11 = _DAT_005f4040;
        iVar30 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        uVar27 = (ulong)iVar30;
        if (0 < (long)uVar27) {
          pDVar23 = (this->m_dupRows).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar31 = uVar27 - 1;
          auVar44._8_4_ = (int)lVar31;
          auVar44._0_8_ = lVar31;
          auVar44._12_4_ = (int)((ulong)lVar31 >> 0x20);
          lVar31 = 0;
          auVar44 = auVar44 ^ _DAT_005f4040;
          auVar45 = _DAT_005f4020;
          auVar46 = _DAT_005f4030;
          do {
            auVar47 = auVar46 ^ auVar11;
            iVar18 = auVar44._4_4_;
            if ((bool)(~(auVar47._4_4_ == iVar18 && auVar44._0_4_ < auVar47._0_4_ ||
                        iVar18 < auVar47._4_4_) & 1)) {
              *(undefined4 *)
               ((long)&(pDVar23->
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).memused + lVar31) = 0;
            }
            if ((auVar47._12_4_ != auVar44._12_4_ || auVar47._8_4_ <= auVar44._8_4_) &&
                auVar47._12_4_ <= auVar44._12_4_) {
              *(undefined4 *)
               ((long)&pDVar23[1].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused + lVar31) = 0;
            }
            auVar47 = auVar45 ^ auVar11;
            iVar21 = auVar47._4_4_;
            if (iVar21 <= iVar18 && (iVar21 != iVar18 || auVar47._0_4_ <= auVar44._0_4_)) {
              *(undefined4 *)
               ((long)&pDVar23[2].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused + lVar31) = 0;
              *(undefined4 *)
               ((long)&pDVar23[3].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused + lVar31) = 0;
            }
            lVar39 = auVar46._8_8_;
            auVar46._0_8_ = auVar46._0_8_ + 4;
            auVar46._8_8_ = lVar39 + 4;
            lVar39 = auVar45._8_8_;
            auVar45._0_8_ = auVar45._0_8_ + 4;
            auVar45._8_8_ = lVar39 + 4;
            lVar31 = lVar31 + 0x80;
          } while ((ulong)(iVar30 + 3U >> 2) << 7 != lVar31);
          if (0 < iVar30) {
            lVar31 = 0;
            do {
              local_2a8[lVar31] = false;
              iVar30 = local_408[lVar31];
              pDVar23 = (local_710->m_dupRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0xa00000000;
              _old_verbosity = (undefined1  [16])0x0;
              local_738 = (int *)0x0;
              _uStack_730 = 0;
              uStack_72b = 0;
              _local_728 = 0;
              uStack_723 = 0;
              local_720 = 0;
              local_71c = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&old_verbosity,0.0);
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add(pDVar23 + iVar30,(int)lVar31,
                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&old_verbosity);
              lVar31 = lVar31 + 1;
              uVar27 = (ulong)(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
              this = local_710;
            } while (lVar31 < (long)uVar27);
          }
        }
        perm_tmp = (int *)0x0;
        spx_alloc<int*>(&perm_tmp,(int)uVar27);
        uVar32 = uVar27 & 0xffffffff;
        local_5f8 = uVar27;
        if (0 < (int)uVar27) {
          memset(perm_tmp,0,uVar32 * 4);
        }
        iVar30 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        if (iVar30 < 1) {
          local_4a8 = (Item *)0xffffffff;
          local_4d0 = (Item *)0xffffffff;
        }
        else {
          pDVar23 = (this->m_dupRows).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pIVar24 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.theitem;
          pDVar9 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey;
          local_4d0 = (Item *)0xffffffff;
          uVar27 = 0;
          uVar36 = 0xffffffff;
          do {
            if ((1 < pDVar23[uVar27].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused) &&
               (pNVar5 = pDVar23[uVar27].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem,
               pIVar24[pDVar9[pNVar5->idx].idx].data.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused != 1)) {
              if ((int)uVar36 < 0) {
                uVar36 = (uint)uVar27;
              }
              piVar33 = &pNVar5[1].idx;
              lVar31 = 1;
              do {
                perm_tmp[*piVar33] = -1;
                lVar31 = lVar31 + 1;
                piVar33 = piVar33 + 0xf;
              } while (lVar31 < pDVar23[uVar27].
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused);
              iVar30 = (lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum;
              local_4d0 = (Item *)(uVar27 & 0xffffffff);
            }
            uVar27 = uVar27 + 1;
          } while ((long)uVar27 < (long)iVar30);
          local_4a8 = (Item *)(ulong)uVar36;
        }
        if (0 < (int)local_5f8) {
          uVar27 = 0;
          iVar30 = 0;
          do {
            if (-1 < perm_tmp[uVar27]) {
              perm_tmp[uVar27] = iVar30;
              iVar30 = iVar30 + 1;
            }
            uVar27 = uVar27 + 1;
          } while (uVar32 != uVar27);
        }
        local_668 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)&(lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left;
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::vector(&newLhsVec.val,
                 (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)local_668);
        local_618 = &(lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).right;
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::vector(&newRhsVec.val,&local_618->val);
        uVar36 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        uVar27 = (ulong)uVar36;
        if (0 < (int)uVar36) {
          a = *(double *)(in_FS_OFFSET + -8);
          local_678 = -a;
          uStack_670 = 0x8000000000000000;
          local_3b8 = &local_710->m_hist;
          iVar18 = (int)local_5f8;
          iVar30 = iVar18;
          if (iVar18 < 1) {
            iVar18 = 1;
            iVar30 = 0;
          }
          pIVar24 = (Item *)0x0;
          bVar15 = false;
          do {
            pSVar37 = local_710;
            pDVar23 = (local_710->m_dupRows).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pDVar41 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pIVar24 * 0x20);
            iVar21 = *(int *)((long)&(pDVar41->
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).memused + (long)pDVar23);
            local_620 = pIVar24;
            if ((1 < iVar21) &&
               ((lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem
                [(lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey
                 [*(int *)(*(long *)((long)&(pDVar41->
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).m_elem + (long)pDVar23) + 0x38)].idx].data.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused != 1)) {
              piVar33 = (local_710->m_stat).data;
              piVar33[0xc] = iVar21 + piVar33[0xc] + -1;
              ::soplex::infinity::__tls_init();
              local_3f8.fpclass = cpp_dec_float_finite;
              local_3f8.prec_elem = 10;
              local_3f8.data._M_elems[0] = 0;
              local_3f8.data._M_elems[1] = 0;
              local_3f8.data._M_elems[2] = 0;
              local_3f8.data._M_elems[3] = 0;
              local_3f8.data._M_elems[4] = 0;
              local_3f8.data._M_elems[5] = 0;
              local_3f8.data._M_elems._24_5_ = 0;
              local_3f8.data._M_elems[7]._1_3_ = 0;
              local_3f8.data._M_elems._32_5_ = 0;
              local_3f8.data._M_elems[9]._1_3_ = 0;
              local_3f8.exp = 0;
              local_3f8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_3f8,local_678);
              ::soplex::infinity::__tls_init();
              local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0xa00000000;
              _old_verbosity = ZEXT816(0);
              local_738 = (int *)0x0;
              _uStack_730 = 0;
              uStack_72b = 0;
              _local_728 = 0;
              uStack_723 = 0;
              local_720 = 0;
              local_71c = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&old_verbosity,a);
              local_428[1]._1_3_ = uStack_723;
              local_428._0_5_ = _local_728;
              auStack_430[1]._1_3_ = uStack_72b;
              auStack_430._0_5_ = _uStack_730;
              local_438 = local_738;
              local_448 = _old_verbosity;
              piStack_440 = (int *)auStack_744._4_8_;
              local_420 = local_720;
              local_41c = local_71c;
              local_418 = local_718;
              local_4e4 = *(uint *)((long)&(pDVar41->
                                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).memused +
                                   (long)(pSVar37->m_dupRows).data.
                                         super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              local_4e0 = (bool *)0x0;
              local_4d8 = 1.2;
              local_4e8 = local_4e4;
              if ((int)local_4e4 < 1) {
                local_4e8 = 0;
                local_4e4 = 1;
              }
              spx_alloc<bool*>(&local_4e0,local_4e4);
              pDVar23 = (pSVar37->m_dupRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar42 = true;
              if (0 < *(int *)((long)&(pDVar41->
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).memused + (long)pDVar23)) {
                lVar31 = (long)&pDVar41->_vptr_DSVectorBase + (long)pDVar23;
                local_5f0 = CONCAT44(local_5f0._4_4_,0xffffffff);
                lVar39 = 0x38;
                lVar22 = 0;
                local_5e8 = CONCAT44(local_5e8._4_4_,0xffffffff);
                iVar21 = -1;
                local_688 = pDVar41;
                do {
                  iVar20 = *(int *)(*(long *)(lVar31 + 8) + lVar39);
                  lVar34 = (long)iVar20;
                  lVar31 = *(long *)(((cpp_dec_float<50U,_int,_void> *)
                                     &local_668->_vptr_DSVectorBase)->data)._M_elems;
                  lVar38 = lVar34 * 0x38;
                  bVar42 = false;
                  if ((*(int *)(lVar31 + 0x30 + lVar38) != 2) &&
                     (pnVar35 = (local_618->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start, bVar42 = false,
                     pnVar35[lVar34].m_backend.fpclass != cpp_dec_float_NaN)) {
                    iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)(lVar31 + lVar38),
                                        &pnVar35[lVar34].m_backend);
                    bVar42 = iVar19 == 0;
                  }
                  local_4e0[lVar22] = bVar42;
                  if (iVar21 == -1) {
                    lVar31 = *(long *)(((cpp_dec_float<50U,_int,_void> *)
                                       &local_668->_vptr_DSVectorBase)->data)._M_elems;
                    uVar6 = *(undefined8 *)(lVar31 + 0x20 + lVar38);
                    local_3f8.data._M_elems._32_5_ = SUB85(uVar6,0);
                    local_3f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
                    puVar3 = (uint *)(lVar31 + 0x10 + lVar38);
                    uVar6 = *(undefined8 *)(puVar3 + 2);
                    local_3f8.data._M_elems._16_8_ = *(undefined8 *)puVar3;
                    local_3f8.data._M_elems._24_5_ = SUB85(uVar6,0);
                    local_3f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
                    local_3f8.data._M_elems._0_8_ = *(undefined8 *)(lVar31 + lVar38);
                    local_3f8.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar31 + lVar38) + 2);
                    local_3f8.exp = *(int *)(lVar31 + 0x28 + lVar38);
                    local_3f8.neg = (bool)*(undefined1 *)(lVar31 + 0x2c + lVar38);
                    local_3f8._48_8_ = *(undefined8 *)(lVar31 + 0x30 + lVar38);
                    pnVar35 = (local_618->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    local_428 = (uint  [2])
                                *(undefined8 *)(pnVar35[lVar34].m_backend.data._M_elems + 8);
                    puVar3 = pnVar35[lVar34].m_backend.data._M_elems + 4;
                    local_438 = *(int **)puVar3;
                    auStack_430 = (uint  [2])*(undefined8 *)(puVar3 + 2);
                    local_448 = *(int **)&pnVar35[lVar34].m_backend.data;
                    piStack_440 = *(int **)(pnVar35[lVar34].m_backend.data._M_elems + 2);
                    local_420 = pnVar35[lVar34].m_backend.exp;
                    local_41c = pnVar35[lVar34].m_backend.neg;
                    local_418 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  **)&pnVar35[lVar34].m_backend.fpclass;
                    iVar21 = iVar20;
                  }
                  else {
                    result_2.m_backend.fpclass = cpp_dec_float_finite;
                    result_2.m_backend.prec_elem = 10;
                    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                    result_2.m_backend.data._M_elems[4] = 0;
                    result_2.m_backend.data._M_elems[5] = 0;
                    result_2.m_backend.data._M_elems._24_5_ = 0;
                    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
                    result_2.m_backend.data._M_elems._32_5_ = 0;
                    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
                    result_2.m_backend.exp = 0;
                    result_2.m_backend.neg = false;
                    local_698 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)0xa00000000;
                    perm = (int *)0x0;
                    piStack_6c0 = (int *)0x0;
                    local_6b8 = (int *)0x0;
                    _uStack_6b0 = 0;
                    uStack_6ab = 0;
                    _local_6a8 = 0;
                    uStack_6a3 = 0;
                    local_6a0 = 0;
                    local_69c = false;
                    factor.m_backend.fpclass = cpp_dec_float_finite;
                    factor.m_backend.prec_elem = 10;
                    factor.m_backend.data._M_elems[0] = 0;
                    factor.m_backend.data._M_elems[1] = 0;
                    factor.m_backend.data._M_elems[2] = 0;
                    factor.m_backend.data._M_elems[3] = 0;
                    factor.m_backend.data._M_elems[4] = 0;
                    factor.m_backend.data._M_elems[5] = 0;
                    factor.m_backend.data._M_elems._24_5_ = 0;
                    factor.m_backend.data._M_elems[7]._1_3_ = 0;
                    factor.m_backend.data._M_elems._32_5_ = 0;
                    factor.m_backend.data._M_elems[9]._1_3_ = 0;
                    factor.m_backend.exp = 0;
                    factor.m_backend.neg = false;
                    boost::multiprecision::default_ops::
                    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (&factor.m_backend,
                               &scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar21].m_backend,
                               &scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend);
                    if (factor.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_002e69aa:
                      pcVar40 = &(local_618->val).
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend;
                      ::soplex::infinity::__tls_init();
                      local_628 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      local_658._0_4_ = 0;
                      local_658._4_4_ = 0;
                      piStack_650 = (int *)0x0;
                      local_648 = (int *)0x0;
                      _uStack_640 = 0;
                      uStack_63b = 0;
                      _local_638 = 0;
                      uStack_633 = 0;
                      local_630 = 0;
                      local_62c = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)local_658,a);
                      if (((pcVar40->fpclass == cpp_dec_float_NaN) ||
                          ((fpclass_type)local_628 == cpp_dec_float_NaN)) ||
                         (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(pcVar40,(cpp_dec_float<50U,_int,_void> *)local_658),
                         iVar19 < 0)) {
                        pnVar35 = (local_618->val).
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar34;
                        local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0xa00000000;
                        _old_verbosity = ZEXT816(0);
                        local_738 = (int *)0x0;
                        _uStack_730 = 0;
                        uStack_72b = 0;
                        _local_728 = 0;
                        uStack_723 = 0;
                        local_720 = 0;
                        local_71c = false;
                        if ((pointer)&old_verbosity != pnVar35) {
                          uVar6 = *(undefined8 *)((pnVar35->m_backend).data._M_elems + 8);
                          _local_728 = (undefined5)uVar6;
                          uStack_723 = (undefined3)((ulong)uVar6 >> 0x28);
                          _old_verbosity = *(undefined1 (*) [16])&(pnVar35->m_backend).data;
                          local_738 = *(int **)((pnVar35->m_backend).data._M_elems + 4);
                          uVar6 = *(undefined8 *)((pnVar35->m_backend).data._M_elems + 6);
                          _uStack_730 = (undefined5)uVar6;
                          uStack_72b = (undefined3)((ulong)uVar6 >> 0x28);
                          local_720 = (pnVar35->m_backend).exp;
                          local_71c = (pnVar35->m_backend).neg;
                          local_718._0_4_ = (pnVar35->m_backend).fpclass;
                          local_718._4_4_ = (pnVar35->m_backend).prec_elem;
                        }
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&factor.m_backend
                                  );
                      }
                      else {
                        ::soplex::infinity::__tls_init();
                        local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0xa00000000;
                        _old_verbosity = ZEXT816(0);
                        local_738 = (int *)0x0;
                        _uStack_730 = 0;
                        uStack_72b = 0;
                        _local_728 = 0;
                        uStack_723 = 0;
                        local_720 = 0;
                        local_71c = false;
                        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                  ((cpp_dec_float<50u,int,void> *)&old_verbosity,local_678);
                      }
                      result_2.m_backend.data._M_elems._32_5_ = _local_728;
                      result_2.m_backend.data._M_elems[9]._1_3_ = uStack_723;
                      result_2.m_backend.data._M_elems._16_8_ = local_738;
                      result_2.m_backend.data._M_elems._24_5_ = _uStack_730;
                      result_2.m_backend.data._M_elems[7]._1_3_ = uStack_72b;
                      result_2.m_backend.data._M_elems[0] = old_verbosity;
                      result_2.m_backend.data._M_elems[1] = auStack_744._0_4_;
                      result_2.m_backend.data._M_elems[2] = auStack_744._4_4_;
                      result_2.m_backend.data._M_elems[3] = auStack_744._8_4_;
                      result_2.m_backend.exp = local_720;
                      result_2.m_backend.neg = local_71c;
                      result_2.m_backend._48_8_ = local_718;
                      pcVar40 = (cpp_dec_float<50U,_int,_void> *)
                                (*(long *)(((cpp_dec_float<50U,_int,_void> *)
                                           &local_668->_vptr_DSVectorBase)->data)._M_elems + lVar38)
                      ;
                      ::soplex::infinity::__tls_init();
                      local_628 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      local_658 = (undefined1  [8])0x0;
                      piStack_650 = (int *)0x0;
                      local_648 = (int *)0x0;
                      _uStack_640 = 0;
                      uStack_63b = 0;
                      _local_638 = 0;
                      uStack_633 = 0;
                      local_630 = 0;
                      local_62c = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)local_658,local_678);
                      if (((pcVar40->fpclass == cpp_dec_float_NaN) ||
                          ((fpclass_type)local_628 == cpp_dec_float_NaN)) ||
                         (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(pcVar40,(cpp_dec_float<50U,_int,_void> *)local_658),
                         0 < iVar19)) {
                        pauVar25 = (undefined1 (*) [16])
                                   (lVar38 + *(long *)(((cpp_dec_float<50U,_int,_void> *)
                                                       &local_668->_vptr_DSVectorBase)->data).
                                                      _M_elems);
                        local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0xa00000000;
                        _old_verbosity = ZEXT816(0);
                        local_738 = (int *)0x0;
                        _uStack_730 = 0;
                        uStack_72b = 0;
                        _local_728 = 0;
                        uStack_723 = 0;
                        local_720 = 0;
                        local_71c = false;
                        if ((undefined1 (*) [16])&old_verbosity != pauVar25) {
                          _local_728 = (undefined5)*(undefined8 *)pauVar25[2];
                          uStack_723 = (undefined3)((ulong)*(undefined8 *)pauVar25[2] >> 0x28);
                          _old_verbosity = *pauVar25;
                          local_738 = *(int **)pauVar25[1];
                          _uStack_730 = (undefined5)*(undefined8 *)(pauVar25[1] + 8);
                          uStack_72b = (undefined3)((ulong)*(undefined8 *)(pauVar25[1] + 8) >> 0x28)
                          ;
                          local_720 = *(int *)(pauVar25[2] + 8);
                          local_71c = (bool)pauVar25[2][0xc];
                          local_718 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        **)pauVar25[3];
                        }
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&factor.m_backend
                                  );
                      }
                      else {
                        ::soplex::infinity::__tls_init();
                        local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0xa00000000;
                        _old_verbosity = ZEXT816(0);
                        local_738 = (int *)0x0;
                        _uStack_730 = 0;
                        uStack_72b = 0;
                        _local_728 = 0;
                        uStack_723 = 0;
                        local_720 = 0;
                        local_71c = false;
                        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                  ((cpp_dec_float<50u,int,void> *)&old_verbosity,a);
                      }
                    }
                    else {
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      cpp_dec_float<long_long>
                                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,0,(type *)0x0);
                      iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&factor.m_backend,
                                       (cpp_dec_float<50U,_int,_void> *)&old_verbosity);
                      if (iVar19 < 1) goto LAB_002e69aa;
                      pcVar40 = (cpp_dec_float<50U,_int,_void> *)
                                (*(long *)(((cpp_dec_float<50U,_int,_void> *)
                                           &local_668->_vptr_DSVectorBase)->data)._M_elems + lVar38)
                      ;
                      ::soplex::infinity::__tls_init();
                      local_628 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      local_658._0_4_ = 0;
                      local_658._4_4_ = 0;
                      piStack_650 = (int *)0x0;
                      local_648 = (int *)0x0;
                      _uStack_640 = 0;
                      uStack_63b = 0;
                      _local_638 = 0;
                      uStack_633 = 0;
                      local_630 = 0;
                      local_62c = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)local_658,local_678);
                      if (((pcVar40->fpclass == cpp_dec_float_NaN) ||
                          ((fpclass_type)local_628 == cpp_dec_float_NaN)) ||
                         (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(pcVar40,(cpp_dec_float<50U,_int,_void> *)local_658),
                         0 < iVar19)) {
                        pauVar25 = (undefined1 (*) [16])
                                   (*(long *)(((cpp_dec_float<50U,_int,_void> *)
                                              &local_668->_vptr_DSVectorBase)->data)._M_elems +
                                   lVar38);
                        local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0xa00000000;
                        _old_verbosity = ZEXT816(0);
                        local_738 = (int *)0x0;
                        _uStack_730 = 0;
                        uStack_72b = 0;
                        _local_728 = 0;
                        uStack_723 = 0;
                        local_720 = 0;
                        local_71c = false;
                        if ((undefined1 (*) [16])&old_verbosity != pauVar25) {
                          _local_728 = (undefined5)*(undefined8 *)pauVar25[2];
                          uStack_723 = (undefined3)((ulong)*(undefined8 *)pauVar25[2] >> 0x28);
                          _old_verbosity = *pauVar25;
                          local_738 = *(int **)pauVar25[1];
                          _uStack_730 = (undefined5)*(undefined8 *)(pauVar25[1] + 8);
                          uStack_72b = (undefined3)((ulong)*(undefined8 *)(pauVar25[1] + 8) >> 0x28)
                          ;
                          local_720 = *(int *)(pauVar25[2] + 8);
                          local_71c = (bool)pauVar25[2][0xc];
                          local_718._0_4_ = *(fpclass_type *)((long)(pauVar25 + 3) + 0);
                          local_718._4_4_ = *(int32_t *)((long)(pauVar25 + 3) + 4);
                        }
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&factor.m_backend
                                  );
                      }
                      else {
                        ::soplex::infinity::__tls_init();
                        local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0xa00000000;
                        _old_verbosity = ZEXT816(0);
                        local_738 = (int *)0x0;
                        _uStack_730 = 0;
                        uStack_72b = 0;
                        _local_728 = 0;
                        uStack_723 = 0;
                        local_720 = 0;
                        local_71c = false;
                        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                  ((cpp_dec_float<50u,int,void> *)&old_verbosity,local_678);
                      }
                      result_2.m_backend.data._M_elems._32_5_ = _local_728;
                      result_2.m_backend.data._M_elems[9]._1_3_ = uStack_723;
                      result_2.m_backend.data._M_elems._16_8_ = local_738;
                      result_2.m_backend.data._M_elems._24_5_ = _uStack_730;
                      result_2.m_backend.data._M_elems[7]._1_3_ = uStack_72b;
                      result_2.m_backend.data._M_elems[0] = old_verbosity;
                      result_2.m_backend.data._M_elems[1] = auStack_744._0_4_;
                      result_2.m_backend.data._M_elems[2] = auStack_744._4_4_;
                      result_2.m_backend.data._M_elems[3] = auStack_744._8_4_;
                      result_2.m_backend.exp = local_720;
                      result_2.m_backend.neg = local_71c;
                      result_2.m_backend._48_8_ = local_718;
                      pcVar40 = &(local_618->val).
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar34].m_backend;
                      ::soplex::infinity::__tls_init();
                      local_628 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      local_658 = (undefined1  [8])0x0;
                      piStack_650 = (int *)0x0;
                      local_648 = (int *)0x0;
                      _uStack_640 = 0;
                      uStack_63b = 0;
                      _local_638 = 0;
                      uStack_633 = 0;
                      local_630 = 0;
                      local_62c = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)local_658,a);
                      if (((pcVar40->fpclass == cpp_dec_float_NaN) ||
                          ((fpclass_type)local_628 == cpp_dec_float_NaN)) ||
                         (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(pcVar40,(cpp_dec_float<50U,_int,_void> *)local_658),
                         iVar19 < 0)) {
                        pnVar35 = (local_618->val).
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar34;
                        local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0xa00000000;
                        _old_verbosity = ZEXT816(0);
                        local_738 = (int *)0x0;
                        _uStack_730 = 0;
                        uStack_72b = 0;
                        _local_728 = 0;
                        uStack_723 = 0;
                        local_720 = 0;
                        local_71c = false;
                        if ((pointer)&old_verbosity != pnVar35) {
                          uVar6 = *(undefined8 *)((pnVar35->m_backend).data._M_elems + 8);
                          _local_728 = (undefined5)uVar6;
                          uStack_723 = (undefined3)((ulong)uVar6 >> 0x28);
                          _old_verbosity = *(undefined1 (*) [16])&(pnVar35->m_backend).data;
                          local_738 = *(int **)((pnVar35->m_backend).data._M_elems + 4);
                          uVar6 = *(undefined8 *)((pnVar35->m_backend).data._M_elems + 6);
                          _uStack_730 = (undefined5)uVar6;
                          uStack_72b = (undefined3)((ulong)uVar6 >> 0x28);
                          local_720 = (pnVar35->m_backend).exp;
                          local_71c = (pnVar35->m_backend).neg;
                          local_718 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        **)&(pnVar35->m_backend).fpclass;
                        }
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&factor.m_backend
                                  );
                      }
                      else {
                        ::soplex::infinity::__tls_init();
                        local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)0xa00000000;
                        _old_verbosity = ZEXT816(0);
                        local_738 = (int *)0x0;
                        _uStack_730 = 0;
                        uStack_72b = 0;
                        _local_728 = 0;
                        uStack_723 = 0;
                        local_720 = 0;
                        local_71c = false;
                        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                  ((cpp_dec_float<50u,int,void> *)&old_verbosity,a);
                      }
                    }
                    _local_6a8 = _local_728;
                    uStack_6a3 = uStack_723;
                    local_6b8 = local_738;
                    _uStack_6b0 = _uStack_730;
                    uStack_6ab = uStack_72b;
                    perm = _old_verbosity;
                    piStack_6c0 = (int *)auStack_744._4_8_;
                    local_6a0 = local_720;
                    local_69c = local_71c;
                    local_698 = local_718;
                    if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
                        (local_3f8.fpclass != cpp_dec_float_NaN)) &&
                       (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(&result_2.m_backend,&local_3f8),
                       auVar11 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_,
                       result_2.m_backend.data._M_elems._0_16_ = auVar11, 0 < iVar19)) {
                      local_3f8.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
                      local_3f8.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
                      local_3f8.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
                      local_3f8.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
                      local_3f8.data._M_elems._24_5_ = result_2.m_backend.data._M_elems._24_5_;
                      local_3f8.data._M_elems[7]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
                      local_3f8.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
                      local_3f8.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
                      local_3f8.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
                      local_3f8.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
                      local_3f8.exp = result_2.m_backend.exp;
                      local_3f8.neg = result_2.m_backend.neg;
                      local_3f8.fpclass = result_2.m_backend.fpclass;
                      local_3f8.prec_elem = result_2.m_backend.prec_elem;
                      local_5e8 = CONCAT44(local_5e8._4_4_,iVar20);
                    }
                    if ((((fpclass_type)local_698 != cpp_dec_float_NaN) &&
                        ((fpclass_type)local_418 != cpp_dec_float_NaN)) &&
                       (iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare((cpp_dec_float<50U,_int,_void> *)&perm,
                                         (cpp_dec_float<50U,_int,_void> *)&local_448), iVar19 < 0))
                    {
                      uVar10._5_3_ = uStack_6a3;
                      uVar10._0_5_ = _local_6a8;
                      local_428[0] = (uint)_local_6a8;
                      local_428[1] = SUB84(uVar10,4);
                      uVar6._5_3_ = uStack_6ab;
                      uVar6._0_5_ = _uStack_6b0;
                      local_438 = local_6b8;
                      auStack_430[0] = (uint)_uStack_6b0;
                      auStack_430[1] = SUB84(uVar6,4);
                      local_448 = perm;
                      piStack_440 = piStack_6c0;
                      local_420 = local_6a0;
                      local_41c = local_69c;
                      local_418 = local_698;
                      local_5f0 = CONCAT44(local_5f0._4_4_,iVar20);
                    }
                    local_2a8[lVar34] = true;
                  }
                  pSVar37 = local_710;
                  lVar22 = lVar22 + 1;
                  lVar31 = (long)&local_688->_vptr_DSVectorBase +
                           (long)(local_710->m_dupRows).data.
                                 super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  lVar39 = lVar39 + 0x3c;
                } while (lVar22 < *(int *)(lVar31 + 0x14));
                if (iVar21 == -1) {
                  bVar42 = true;
                }
                else {
                  lVar39 = (long)iVar21;
                  lVar31 = *(long *)(((cpp_dec_float<50U,_int,_void> *)
                                     &local_668->_vptr_DSVectorBase)->data)._M_elems;
                  lVar22 = lVar39 * 0x38;
                  iVar20 = (int)local_5f8;
                  pDVar41 = local_668;
                  if ((local_3f8.fpclass == cpp_dec_float_NaN) ||
                     (pcVar40 = &local_3f8, *(int *)(lVar31 + 0x30 + lVar22) == 2)) {
LAB_002e706f:
                    pcVar40 = (cpp_dec_float<50U,_int,_void> *)(lVar31 + lVar22);
                  }
                  else {
                    iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (pcVar40,(cpp_dec_float<50U,_int,_void> *)(lVar31 + lVar22));
                    if (iVar19 < 1) {
                      lVar31 = *(long *)(((cpp_dec_float<50U,_int,_void> *)
                                         &local_668->_vptr_DSVectorBase)->data)._M_elems;
                      goto LAB_002e706f;
                    }
                  }
                  local_518 = *(int **)((pcVar40->data)._M_elems + 8);
                  local_538 = *(int **)(pcVar40->data)._M_elems;
                  piStack_530 = *(int **)((pcVar40->data)._M_elems + 2);
                  local_528 = *(int **)((pcVar40->data)._M_elems + 4);
                  piStack_520 = *(int **)((pcVar40->data)._M_elems + 6);
                  local_510 = pcVar40->exp;
                  local_50c = pcVar40->neg;
                  local_508 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                **)&pcVar40->fpclass;
                  pnVar35 = (local_618->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (((fpclass_type)local_418 == cpp_dec_float_NaN) ||
                     (pnVar35[lVar39].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_002e710a:
                    pnVar35 = pnVar35 + lVar39;
                  }
                  else {
                    iVar19 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)&local_448,
                                        &pnVar35[lVar39].m_backend);
                    pnVar35 = (pointer)&local_448;
                    iVar20 = (int)local_5f8;
                    pSVar37 = local_710;
                    if (-1 < iVar19) {
                      pnVar35 = (local_618->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      goto LAB_002e710a;
                    }
                  }
                  local_558 = *(int **)((pnVar35->m_backend).data._M_elems + 8);
                  local_578 = *(int **)&(pnVar35->m_backend).data;
                  piStack_570 = *(int **)((pnVar35->m_backend).data._M_elems + 2);
                  local_568 = *(int **)((pnVar35->m_backend).data._M_elems + 4);
                  piStack_560 = *(int **)((pnVar35->m_backend).data._M_elems + 6);
                  local_550 = (pnVar35->m_backend).exp;
                  local_54c = (pnVar35->m_backend).neg;
                  local_548 = *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                **)&(pnVar35->m_backend).fpclass;
                  if (local_620 == local_4d0) {
                    local_500.data = (int *)0x0;
                    local_500.memFactor = 1.2;
                    local_500.themax = iVar18;
                    local_500.thesize = iVar30;
                    spx_alloc<int*>(&local_500.data,iVar18);
                    if (0 < iVar20) {
                      uVar27 = 0;
                      do {
                        (((cpp_dec_float<50U,_int,_void> *)local_500.data)->data)._M_elems[uVar27] =
                             perm_tmp[uVar27];
                        uVar27 = uVar27 + 1;
                        pDVar41 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)local_500.data;
                      } while (uVar32 != uVar27);
                    }
                    local_600 = (DuplicateRowsPS *)operator_new(0x100);
                    dupRows = (local_710->m_dupRows).data.
                              super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + (long)local_4d0;
                    Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::Array(&local_398,&scale);
                    DataArray<int>::DataArray(&local_2c8,&local_500);
                    local_480.thesize = local_4e8;
                    local_480.themax = local_4e4;
                    local_480.data = (bool *)0x0;
                    local_480.memFactor = local_4d8;
                    spx_alloc<bool*>(&local_480.data,local_4e4);
                    if ((ulong)(uint)local_480.thesize != 0) {
                      memcpy(local_480.data,local_4e0,(ulong)(uint)local_480.thesize);
                    }
                    bVar13 = local_50c;
                    iVar19 = local_510;
                    bVar42 = local_54c;
                    iVar20 = local_550;
                    local_108 = local_518;
                    local_118 = local_528;
                    piStack_110 = piStack_520;
                    local_128 = local_538;
                    piStack_120 = piStack_530;
                    local_308 = local_508;
                    uStack_300 = 0;
                    local_138 = local_558;
                    local_148 = local_568;
                    piStack_140 = piStack_560;
                    local_158 = local_578;
                    piStack_150 = piStack_570;
                    local_318 = local_548;
                    uStack_310 = 0;
                    pTVar7 = (local_710->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    local_688 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)(local_710->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                    if (local_688 !=
                        (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        *(int *)&(local_688->
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).m_elem =
                             *(int *)&(local_688->
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).m_elem + 1;
                        UNLOCK();
                      }
                      else {
                        *(int *)&(local_688->
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).m_elem =
                             *(int *)&(local_688->
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).m_elem + 1;
                      }
                    }
                    RVar43 = Tolerances::epsilon(pTVar7);
                    factor.m_backend.data._M_elems._0_8_ = local_128;
                    factor.m_backend.data._M_elems._8_8_ = piStack_120;
                    factor.m_backend.data._M_elems._16_8_ = local_118;
                    factor.m_backend.data._M_elems._24_5_ = SUB85(piStack_110,0);
                    factor.m_backend.data._M_elems[7]._1_3_ =
                         (undefined3)((ulong)piStack_110 >> 0x28);
                    factor.m_backend.data._M_elems._32_5_ = SUB85(local_108,0);
                    factor.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_108 >> 0x28)
                    ;
                    factor.m_backend.exp = iVar19;
                    factor.m_backend.neg = bVar13;
                    factor.m_backend._48_8_ = local_308;
                    local_658 = (undefined1  [8])local_158;
                    piStack_650 = piStack_150;
                    local_648 = local_148;
                    _uStack_640 = SUB85(piStack_140,0);
                    uStack_63b = (undefined3)((ulong)piStack_140 >> 0x28);
                    _local_638 = SUB85(local_138,0);
                    uStack_633 = (undefined3)((ulong)local_138 >> 0x28);
                    local_630 = iVar20;
                    local_62c = bVar42;
                    local_628 = local_318;
                    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&perm,(soplex *)&factor,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_658,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)pDVar41);
                    result_2.m_backend.data._M_elems._32_5_ = _local_6a8;
                    result_2.m_backend.data._M_elems[9]._1_3_ = uStack_6a3;
                    result_2.m_backend.data._M_elems._16_8_ = local_6b8;
                    result_2.m_backend.data._M_elems._24_5_ = _uStack_6b0;
                    result_2.m_backend.data._M_elems[7]._1_3_ = uStack_6ab;
                    result_2.m_backend.data._M_elems._8_8_ = piStack_6c0;
                    result_2.m_backend.data._M_elems._0_8_ = perm;
                    auVar11 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
                    result_2.m_backend.exp = local_6a0;
                    result_2.m_backend.neg = local_69c;
                    result_2.m_backend._48_8_ = local_698;
                    if ((local_69c == true) &&
                       (result_2.m_backend.data._M_elems[0] = (uint)perm,
                       result_2.m_backend.data._M_elems[0] != 0 || (int)local_698 != 0)) {
                      result_2.m_backend.neg = false;
                    }
                    result_2.m_backend.data._M_elems._0_16_ = auVar11;
                    if (NAN(RVar43) || (int)local_698 == 2) {
                      bVar42 = false;
                    }
                    else {
                      local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      _old_verbosity = ZEXT816(0);
                      local_738 = (int *)0x0;
                      _uStack_730 = 0;
                      uStack_72b = 0;
                      _local_728 = 0;
                      uStack_723 = 0;
                      local_720 = 0;
                      local_71c = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)&old_verbosity,RVar43);
                      iVar20 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&result_2.m_backend,
                                       (cpp_dec_float<50U,_int,_void> *)&old_verbosity);
                      bVar42 = iVar20 < 1;
                    }
                    pDVar12 = local_600;
                    local_370.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (local_710->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    local_370.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (local_710->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                    if (local_370.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_370.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_370.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_370.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_370.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)(local_5e8 & 0xffffffff);
                    DuplicateRowsPS::DuplicateRowsPS
                              (local_600,lp,iVar21,(int)local_5e8,(int)local_5f0,dupRows,&local_398,
                               &local_2c8,&local_480,true,bVar42,&local_370,
                               (int)local_4d0 == (int)local_4a8);
                    ptr.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = &pDVar12->super_PostStep;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS*>
                              (&ptr.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,pDVar12);
                    if (local_370.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_370.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if (local_688 !=
                        (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_688);
                    }
                    if (local_480.data != (bool *)0x0) {
                      free(local_480.data);
                      local_480.data = (bool *)0x0;
                    }
                    if (local_2c8.data != (int *)0x0) {
                      free(local_2c8.data);
                      local_2c8.data = (int *)0x0;
                    }
                    if (local_398.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_398.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_398.data.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_398.data.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                    ::push_back(&local_3b8->data,&ptr);
                    if (ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                  }
                  else {
                    local_500.data = (int *)0x0;
                    local_500.memFactor = 1.2;
                    local_500.thesize = 0;
                    local_500.themax = 1;
                    spx_alloc<int*>(&local_500.data,1);
                    local_600 = (DuplicateRowsPS *)operator_new(0x100);
                    local_688 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)((long)&local_688->_vptr_DSVectorBase +
                                   (long)(pSVar37->m_dupRows).data.
                                         super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
                    Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::Array(&local_3b0,&scale);
                    DataArray<int>::DataArray(&local_2e0,&local_500);
                    local_498.thesize = local_4e8;
                    local_498.themax = local_4e4;
                    local_498.data = (bool *)0x0;
                    local_498.memFactor = local_4d8;
                    spx_alloc<bool*>(&local_498.data,local_4e4);
                    if ((ulong)(uint)local_498.thesize != 0) {
                      memcpy(local_498.data,local_4e0,(ulong)(uint)local_498.thesize);
                    }
                    bVar13 = local_50c;
                    iVar19 = local_510;
                    bVar42 = local_54c;
                    iVar20 = local_550;
                    local_168 = local_518;
                    local_178 = local_528;
                    piStack_170 = piStack_520;
                    local_188 = local_538;
                    piStack_180 = piStack_530;
                    local_308 = local_508;
                    uStack_300 = 0;
                    local_198 = local_558;
                    local_1a8 = local_568;
                    piStack_1a0 = piStack_560;
                    local_1b8 = local_578;
                    piStack_1b0 = piStack_570;
                    local_318 = local_548;
                    uStack_310 = 0;
                    pTVar7 = (pSVar37->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    p_Var8 = (pSVar37->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi;
                    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                      }
                    }
                    RVar43 = Tolerances::epsilon(pTVar7);
                    factor.m_backend.data._M_elems._0_8_ = local_188;
                    factor.m_backend.data._M_elems._8_8_ = piStack_180;
                    factor.m_backend.data._M_elems._16_8_ = local_178;
                    factor.m_backend.data._M_elems._24_5_ = SUB85(piStack_170,0);
                    factor.m_backend.data._M_elems[7]._1_3_ =
                         (undefined3)((ulong)piStack_170 >> 0x28);
                    factor.m_backend.data._M_elems._32_5_ = SUB85(local_168,0);
                    factor.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_168 >> 0x28)
                    ;
                    factor.m_backend.exp = iVar19;
                    factor.m_backend.neg = bVar13;
                    factor.m_backend._48_8_ = local_308;
                    local_658 = (undefined1  [8])local_1b8;
                    piStack_650 = piStack_1b0;
                    local_648 = local_1a8;
                    _uStack_640 = SUB85(piStack_1a0,0);
                    uStack_63b = (undefined3)((ulong)piStack_1a0 >> 0x28);
                    _local_638 = SUB85(local_198,0);
                    uStack_633 = (undefined3)((ulong)local_198 >> 0x28);
                    local_630 = iVar20;
                    local_62c = bVar42;
                    local_628 = local_318;
                    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&perm,(soplex *)&factor,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)local_658,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)pDVar41);
                    result_2.m_backend.data._M_elems._32_5_ = _local_6a8;
                    result_2.m_backend.data._M_elems[9]._1_3_ = uStack_6a3;
                    result_2.m_backend.data._M_elems._16_8_ = local_6b8;
                    result_2.m_backend.data._M_elems._24_5_ = _uStack_6b0;
                    result_2.m_backend.data._M_elems[7]._1_3_ = uStack_6ab;
                    result_2.m_backend.data._M_elems._8_8_ = piStack_6c0;
                    result_2.m_backend.data._M_elems._0_8_ = perm;
                    auVar11 = (undefined1  [16])result_2.m_backend.data._M_elems._0_16_;
                    result_2.m_backend.exp = local_6a0;
                    result_2.m_backend.neg = local_69c;
                    result_2.m_backend._48_8_ = local_698;
                    if ((local_69c == true) &&
                       (result_2.m_backend.data._M_elems[0] = (uint)perm,
                       result_2.m_backend.data._M_elems[0] != 0 || (int)local_698 != 0)) {
                      result_2.m_backend.neg = false;
                    }
                    result_2.m_backend.data._M_elems._0_16_ = auVar11;
                    if (NAN(RVar43) || (int)local_698 == 2) {
                      bVar42 = false;
                    }
                    else {
                      local_718 = (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0xa00000000;
                      _old_verbosity = ZEXT816(0);
                      local_738 = (int *)0x0;
                      _uStack_730 = 0;
                      uStack_72b = 0;
                      _local_728 = 0;
                      uStack_723 = 0;
                      local_720 = 0;
                      local_71c = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)&old_verbosity,RVar43);
                      iVar20 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&result_2.m_backend,
                                       (cpp_dec_float<50U,_int,_void> *)&old_verbosity);
                      bVar42 = iVar20 < 1;
                    }
                    pDVar12 = local_600;
                    local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (local_710->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (local_710->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                    if (local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_380.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_380.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_380.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_380.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)(local_5e8 & 0xffffffff);
                    DuplicateRowsPS::DuplicateRowsPS
                              (local_600,lp,iVar21,(int)local_5e8,(int)local_5f0,local_688,
                               &local_3b0,&local_2e0,&local_498,false,bVar42,&local_380,
                               local_620 == local_4a8);
                    ptr.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = &pDVar12->super_PostStep;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS*>
                              (&ptr.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,pDVar12);
                    if (local_380.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_380.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
                    }
                    if (local_498.data != (bool *)0x0) {
                      free(local_498.data);
                      local_498.data = (bool *)0x0;
                    }
                    if (local_2e0.data != (int *)0x0) {
                      free(local_2e0.data);
                      local_2e0.data = (int *)0x0;
                    }
                    if (local_3b0.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_3b0.data.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_3b0.data.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_3b0.data.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                    ::push_back(&local_3b8->data,&ptr);
                    if (ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                  }
                  if ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)local_500.data !=
                      (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x0) {
                    free(local_500.data);
                  }
                  if (((local_3f8.fpclass == cpp_dec_float_NaN) ||
                      (lVar31 = *(long *)(((cpp_dec_float<50U,_int,_void> *)
                                          &local_668->_vptr_DSVectorBase)->data)._M_elems,
                      *(int *)(lVar31 + 0x30 + lVar22) == 2)) ||
                     (iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_3f8,(cpp_dec_float<50U,_int,_void> *)(lVar31 + lVar22)
                                      ), iVar21 < 1)) {
                    bVar42 = true;
                    if ((((fpclass_type)local_418 == cpp_dec_float_NaN) ||
                        (pnVar35 = (local_618->val).
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                        pnVar35[lVar39].m_backend.fpclass == cpp_dec_float_NaN)) ||
                       (iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare((cpp_dec_float<50U,_int,_void> *)&local_448,
                                         &pnVar35[lVar39].m_backend), -1 < iVar21))
                    goto LAB_002e7fcc;
                  }
                  bVar42 = local_50c;
                  iVar20 = local_510;
                  pDVar41 = local_548;
                  bVar15 = local_54c;
                  iVar21 = local_550;
                  local_1c8 = local_558;
                  local_1d8 = local_568;
                  piStack_1d0 = piStack_560;
                  local_1e8 = local_578;
                  piStack_1e0 = piStack_570;
                  local_218 = local_538;
                  piStack_210 = piStack_530;
                  local_208 = local_528;
                  piStack_200 = piStack_520;
                  local_1f8 = local_518;
                  local_688 = local_508;
                  uStack_680 = 0;
                  feastol(&local_a0,local_710);
                  result_2.m_backend.data._M_elems._8_8_ = piStack_1e0;
                  result_2.m_backend.data._M_elems._0_8_ = local_1e8;
                  result_2.m_backend.data._M_elems._16_8_ = local_1d8;
                  result_2.m_backend.data._M_elems._24_5_ = SUB85(piStack_1d0,0);
                  result_2.m_backend.data._M_elems[7]._1_3_ =
                       (undefined3)((ulong)piStack_1d0 >> 0x28);
                  result_2.m_backend.data._M_elems._32_5_ = SUB85(local_1c8,0);
                  result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_1c8 >> 0x28)
                  ;
                  result_2.m_backend.exp = iVar21;
                  result_2.m_backend.neg = bVar15;
                  result_2.m_backend._48_8_ = pDVar41;
                  perm = local_218;
                  piStack_6c0 = piStack_210;
                  local_6b8 = local_208;
                  _uStack_6b0 = SUB85(piStack_200,0);
                  uStack_6ab = (undefined3)((ulong)piStack_200 >> 0x28);
                  _local_6a8 = SUB85(local_1f8,0);
                  uStack_6a3 = (undefined3)((ulong)local_1f8 >> 0x28);
                  local_6a0 = iVar20;
                  local_69c = bVar42;
                  local_698 = local_688;
                  relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&old_verbosity,(soplex *)&result_2,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&perm,pnVar29);
                  factor.m_backend.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
                  factor.m_backend.data._M_elems[1] = local_a0.m_backend.data._M_elems[1];
                  uVar6 = factor.m_backend.data._M_elems._0_8_;
                  factor.m_backend.data._M_elems[2] = local_a0.m_backend.data._M_elems[2];
                  factor.m_backend.data._M_elems[3] = local_a0.m_backend.data._M_elems[3];
                  factor.m_backend.data._M_elems._32_5_ = local_a0.m_backend.data._M_elems._32_5_;
                  factor.m_backend.data._M_elems[9]._1_3_ =
                       local_a0.m_backend.data._M_elems[9]._1_3_;
                  factor.m_backend.data._M_elems[4] = local_a0.m_backend.data._M_elems[4];
                  factor.m_backend.data._M_elems[5] = local_a0.m_backend.data._M_elems[5];
                  factor.m_backend.data._M_elems._24_5_ = local_a0.m_backend.data._M_elems._24_5_;
                  factor.m_backend.data._M_elems[7]._1_3_ =
                       local_a0.m_backend.data._M_elems[7]._1_3_;
                  factor.m_backend.exp = local_a0.m_backend.exp;
                  factor.m_backend.neg = local_a0.m_backend.neg;
                  factor.m_backend.fpclass = local_a0.m_backend.fpclass;
                  factor.m_backend.prec_elem = local_a0.m_backend.prec_elem;
                  factor.m_backend.data._M_elems[0] = local_a0.m_backend.data._M_elems[0];
                  if (factor.m_backend.data._M_elems[0] != 0 ||
                      local_a0.m_backend.fpclass != cpp_dec_float_finite) {
                    factor.m_backend.neg = (bool)(local_a0.m_backend.neg ^ 1);
                  }
                  factor.m_backend.data._M_elems._0_8_ = uVar6;
                  if (((local_a0.m_backend.fpclass == cpp_dec_float_NaN) ||
                      ((fpclass_type)local_718 == cpp_dec_float_NaN)) ||
                     (iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare((cpp_dec_float<50U,_int,_void> *)&old_verbosity,
                                       &factor.m_backend), 0 < iVar21)) {
                    if ((((fpclass_type)local_548 != cpp_dec_float_NaN) &&
                        ((fpclass_type)local_508 != cpp_dec_float_NaN)) &&
                       (iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare((cpp_dec_float<50U,_int,_void> *)&local_578,
                                         (cpp_dec_float<50U,_int,_void> *)&local_538), iVar21 < 0))
                    {
                      local_558 = local_518;
                      local_568 = local_528;
                      piStack_560 = piStack_520;
                      local_578 = local_538;
                      piStack_570 = piStack_530;
                      local_550 = local_510;
                      local_54c = local_50c;
                      local_548 = local_508;
                    }
                    *(int **)(newLhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.data.
                              _M_elems + 8) = local_518;
                    puVar3 = newLhsVec.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.data.
                             _M_elems + 4;
                    *(int **)puVar3 = local_528;
                    *(int **)(puVar3 + 2) = piStack_520;
                    *(int **)newLhsVec.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.data.
                             _M_elems = local_538;
                    *(int **)(newLhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.data.
                              _M_elems + 2) = piStack_530;
                    newLhsVec.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.exp = local_510;
                    newLhsVec.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.neg = local_50c;
                    *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      **)&newLhsVec.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.fpclass =
                         local_508;
                    *(int **)(newRhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.data.
                              _M_elems + 8) = local_558;
                    puVar3 = newRhsVec.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.data.
                             _M_elems + 4;
                    *(int **)puVar3 = local_568;
                    *(int **)(puVar3 + 2) = piStack_560;
                    *(int **)newRhsVec.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.data.
                             _M_elems = local_578;
                    *(int **)(newRhsVec.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.data.
                              _M_elems + 2) = piStack_570;
                    newRhsVec.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.exp = local_550;
                    newRhsVec.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.neg = local_54c;
                    *(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      **)&newRhsVec.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar39].m_backend.fpclass =
                         local_548;
                    bVar42 = true;
                    bVar15 = true;
                  }
                  else {
                    free(perm_tmp);
                    perm_tmp = (int *)0x0;
                    bVar15 = true;
                    bVar42 = false;
                  }
                }
              }
LAB_002e7fcc:
              if (local_4e0 != (bool *)0x0) {
                free(local_4e0);
              }
              if (!bVar42) {
                RVar16 = INFEASIBLE;
                goto LAB_002e82c8;
              }
            }
            pIVar24 = (Item *)((long)&(local_620->data).
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .m_elem + 1);
            uVar27 = (ulong)(lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum;
          } while ((long)pIVar24 < (long)uVar27);
          if (bVar15) {
            (*(lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x38])(lp,&newLhsVec,&newRhsVec);
            uVar27 = (ulong)(uint)(lp->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .set.thenum;
          }
        }
        perm = (int *)0x0;
        iVar30 = (int)uVar27;
        spx_alloc<int*>(&perm,iVar30);
        if (iVar30 < 1) {
          iVar18 = 0;
          iVar21 = 0;
        }
        else {
          pIVar24 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.theitem;
          pDVar9 = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey;
          uVar32 = 0;
          iVar21 = 0;
          iVar18 = 0;
          do {
            if (local_2a8[uVar32] == true) {
              perm[uVar32] = -1;
              iVar18 = iVar18 + 1;
              iVar21 = iVar21 + pIVar24[pDVar9[uVar32].idx].data.
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused;
            }
            else {
              perm[uVar32] = 0;
            }
            uVar32 = uVar32 + 1;
          } while ((uVar27 & 0xffffffff) != uVar32);
        }
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x11])(lp,perm);
        pSVar37 = local_710;
        if (0 < iVar30) {
          piVar33 = (local_710->m_rIdx).data;
          uVar32 = 0;
          do {
            if (-1 < (long)perm[uVar32]) {
              piVar33[perm[uVar32]] = piVar33[uVar32];
            }
            uVar32 = uVar32 + 1;
          } while ((uVar27 & 0xffffffff) != uVar32);
        }
        free(perm);
        RVar16 = OKAY;
        perm = (int *)0x0;
        free(perm_tmp);
        perm_tmp = (int *)0x0;
        if (iVar21 + iVar18 != 0 && SCARRY4(iVar21,iVar18) == iVar21 + iVar18 < 0) {
          piVar33 = &(pSVar37->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remRows;
          *piVar33 = *piVar33 + iVar18;
          piVar33 = &(pSVar37->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remNzos;
          *piVar33 = *piVar33 + iVar21;
          pSVar26 = (pSVar37->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          if ((pSVar26 != (SPxOut *)0x0) && (3 < (int)pSVar26->m_verbosity)) {
            old_verbosity = pSVar26->m_verbosity;
            result_2.m_backend.data._M_elems[0] = 4;
            (*pSVar26->_vptr_SPxOut[2])();
            pSVar26 = soplex::operator<<((pSVar37->
                                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).spxout,"Simplifier (duplicate rows) removed ");
            std::ostream::operator<<((ostream *)pSVar26->m_streams[pSVar26->m_verbosity],iVar18);
            pSVar26 = soplex::operator<<(pSVar26," rows, ");
            std::ostream::operator<<((ostream *)pSVar26->m_streams[pSVar26->m_verbosity],iVar21);
            pSVar26 = soplex::operator<<(pSVar26," non-zeros");
            std::endl<char,std::char_traits<char>>(pSVar26->m_streams[pSVar26->m_verbosity]);
            pSVar26 = (pSVar37->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            (*pSVar26->_vptr_SPxOut[2])(pSVar26,&old_verbosity);
          }
          result_2.m_backend.fpclass = cpp_dec_float_finite;
          result_2.m_backend.prec_elem = 10;
          result_2.m_backend.data._M_elems[0] = 0;
          result_2.m_backend.data._M_elems[1] = 0;
          result_2.m_backend.data._M_elems[2] = 0;
          result_2.m_backend.data._M_elems[3] = 0;
          result_2.m_backend.data._M_elems[4] = 0;
          result_2.m_backend.data._M_elems[5] = 0;
          result_2.m_backend.data._M_elems._24_5_ = 0;
          result_2.m_backend.data._M_elems[7]._1_3_ = 0;
          result_2.m_backend.data._M_elems._32_5_ = 0;
          result_2.m_backend.data._M_elems[9]._1_3_ = 0;
          result_2.m_backend.exp = 0;
          result_2.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,local_2e8,(type *)0x0);
          pnVar29 = &(pSVar37->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_minReduction;
          if (&result_2 != pnVar29) {
            uVar6 = *(undefined8 *)
                     ((pSVar37->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_minReduction.m_backend.data._M_elems + 8);
            result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar6,0);
            result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
            result_2.m_backend.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])(pnVar29->m_backend).data._M_elems;
            result_2.m_backend.data._M_elems._16_8_ =
                 *(undefined8 *)
                  ((pSVar37->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_minReduction.m_backend.data._M_elems + 4);
            uVar6 = *(undefined8 *)
                     ((pSVar37->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).m_minReduction.m_backend.data._M_elems + 6);
            result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar6,0);
            result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
            result_2.m_backend.exp =
                 (pSVar37->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.exp;
            result_2.m_backend.neg =
                 (pSVar37->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.neg;
            result_2.m_backend.fpclass =
                 (pSVar37->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.fpclass;
            result_2.m_backend.prec_elem =
                 (pSVar37->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)&old_verbosity);
          if (result_2.m_backend.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,(long)iVar18,(type *)0x0);
            iVar30 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_2.m_backend,(cpp_dec_float<50U,_int,_void> *)&old_verbosity)
            ;
            if (iVar30 < 0) {
              *local_2f0 = true;
              RVar16 = OKAY;
            }
          }
        }
LAB_002e82c8:
        if (newRhsVec.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(newRhsVec.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)newRhsVec.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)newRhsVec.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (newLhsVec.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(newLhsVec.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)newLhsVec.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)newLhsVec.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_2a8 != (bool *)0x0) {
          free(local_2a8);
        }
        if (scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)scale.data.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_328 != (int *)0x0) {
          free(local_328);
        }
        if (local_408 != (int *)0x0) {
          free(local_408);
        }
      }
    }
  }
  return RVar16;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateRows(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate rows
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   // Possible extension: use generalized definition of duplicate rows according to Andersen and Andersen
   // However: the resulting sparsification is often very small since the involved rows are usually very sparse

   int remRows = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

#if SOPLEX_ROW_SINGLETON
   int rs_remRows = 0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 1)
      {
         removeRowSingleton(lp, row, i);
         rs_remRows++;
      }
   }

   if(rs_remRows > 0)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) <<
                    "Simplifier duplicate rows (row singleton stage) removed "
                    << rs_remRows << " rows, "
                    << rs_remRows << " non-zeros"
                    << std::endl;)
   }

#endif

   if(lp.nRows() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nRows());           // class of parallel rows
   DataArray<int>    classSize(lp.nRows());        // size of each class
   Array<R>   scale(lp.nRows());            // scaling factor for each row
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nRows());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nRows(), idxMem);           // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nRows();

   for(int i = 1; i < lp.nRows(); ++i)
   {
      pClass[i] = 0;
      scale[i]  = 0.0;
      classSize[i] = 0;
      idxSet.addIdx(i);
   }

   R oldVal = 0.0;

   // main loop
   for(int j = 0; j < lp.nCols(); ++j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);
         int  i   = col.index(k);

         if(scale[i] == 0.0)
            scale[i] = aij;

         m_classSetRows[pClass[i]].add(i, aij / scale[i]);

         if(--classSize[pClass[i]] == 0)
            idxSet.addIdx(pClass[i]);
      }

      // update each parallel class with non-zero column entry
      for(int m = 0; m < col.size(); ++m)
      {
         int k = pClass[col.index(m)];

         if(m_classSetRows[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled column values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetRows[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetRows[k].hasNaNs());
               assert(!m_classSetRows[k].hasInfs());
               SPxQuicksort(m_classSetRows[k].mem(), m_classSetRows[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetRows[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetRows[k].value(l), oldVal, this->epsZero()))
               {
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetRows[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetRows[k].value(l);
            }

            m_classSetRows[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remRow(lp.nRows());

   for(int k = 0; k < lp.nRows(); ++k)
      m_dupRows[k].clear();

   for(int k = 0; k < lp.nRows(); ++k)
   {
      remRow[k] = false;
      m_dupRows[pClass[k]].add(k, 0.0);
   }

   const int nRowsOld_tmp = lp.nRows();
   int* perm_tmp = nullptr;
   spx_alloc(perm_tmp, nRowsOld_tmp);

   for(int j = 0; j < nRowsOld_tmp; ++j)
   {
      perm_tmp[j] = 0;
   }

   int idxFirstDupRows = -1;
   int idxLastDupRows = -1;
   int numDelRows = 0;

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         idxLastDupRows = k;

         if(idxFirstDupRows < 0)
         {
            idxFirstDupRows = k;
         }

         for(int l = 1; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            perm_tmp[i] = -1;
         }

         numDelRows += (m_dupRows[k].size() - 1);
      }
   }

   {
      int k_tmp, j_tmp = -1;

      for(k_tmp = j_tmp = 0; k_tmp < nRowsOld_tmp; ++k_tmp)
      {
         if(perm_tmp[k_tmp] >= 0)
            perm_tmp[k_tmp] = j_tmp++;
      }
   }

   // store rhs and lhs changes for combined update
   bool doChangeRanges = false;
   VectorBase<R> newLhsVec(lp.lhs());
   VectorBase<R> newRhsVec(lp.rhs());

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM53 {} duplicate rows found\n", m_dupRows[k].size());

         m_stat[DUPLICATE_ROW] += m_dupRows[k].size() - 1;

         // index of one non-column singleton row in dupRows[k]
         int  rowIdx    = -1;
         int  maxLhsIdx = -1;
         int  minRhsIdx = -1;
         R maxLhs    = R(-infinity);
         R minRhs    = +R(infinity);

         DataArray<bool> isLhsEqualRhs(m_dupRows[k].size());

         // determine strictest bounds on constraint
         for(int l = 0; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            isLhsEqualRhs[l] = (lp.lhs(i) == lp.rhs(i));

            SOPLEX_ASSERT_WARN("WMAISM54", isNotZero(scale[i], R(1.0 / R(infinity))));

            if(rowIdx == -1)
            {
               rowIdx = i;
               maxLhs = lp.lhs(rowIdx);
               minRhs = lp.rhs(rowIdx);
            }
            else
            {
               R scaledLhs, scaledRhs;
               R factor = scale[rowIdx] / scale[i];

               if(factor > 0)
               {
                  scaledLhs = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) * factor;
                  scaledRhs = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) * factor;
               }
               else
               {
                  scaledLhs = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) * factor;
                  scaledRhs = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) * factor;
               }

               if(scaledLhs > maxLhs)
               {
                  maxLhs    = scaledLhs;
                  maxLhsIdx = i;
               }

               if(scaledRhs < minRhs)
               {
                  minRhs    = scaledRhs;
                  minRhsIdx = i;
               }

               remRow[i] = true;
            }
         }

         if(rowIdx != -1)
         {
            R newLhs = (maxLhs > lp.lhs(rowIdx)) ? maxLhs : lp.lhs(rowIdx);
            R newRhs = (minRhs < lp.rhs(rowIdx)) ? minRhs : lp.rhs(rowIdx);

            if(k == idxLastDupRows)
            {
               DataArray<int> da_perm(nRowsOld_tmp);

               for(int j = 0; j < nRowsOld_tmp; ++j)
               {
                  da_perm[j] = perm_tmp[j];
               }

               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm, isLhsEqualRhs, true,
                                             EQrel(newLhs, newRhs, this->tolerances()->epsilon()), this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }
            else
            {
               DataArray<int> da_perm_empty(0);
               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm_empty, isLhsEqualRhs, false, EQrel(newLhs, newRhs,
                                                   this->tolerances()->epsilon()),
                                             this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }

            if(maxLhs > lp.lhs(rowIdx) || minRhs < lp.rhs(rowIdx))
            {
               // modify lhs and rhs of constraint rowIdx
               doChangeRanges = true;

               if(LTrel(newRhs, newLhs, feastol()))
               {
                  SPxOut::debug(this, "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n", newLhs,
                                newRhs);
                  spx_free(perm_tmp);
                  return this->INFEASIBLE;
               }

               // if we accept the infeasibility we should clean up the values to avoid problems later
               if(newRhs < newLhs)
                  newRhs = newLhs;

               newLhsVec[rowIdx] = newLhs;
               newRhsVec[rowIdx] = newRhs;
            }
         }
      }
   }

   // change ranges for all modified constraints by one single call (more efficient)
   if(doChangeRanges)
   {
      lp.changeRange(newLhsVec, newRhsVec);
   }

   // remove all rows by one single method call (more efficient)
   const int nRowsOld = lp.nRows();
   int* perm = nullptr;
   spx_alloc(perm, nRowsOld);

   for(int i = 0; i < nRowsOld; ++i)
   {
      if(remRow[i])
      {
         perm[i] = -1;
         ++remRows;
         remNzos += lp.rowVector(i).size();
      }
      else
         perm[i] = 0;
   }

   lp.removeRows(perm);

   for(int i = 0; i < nRowsOld; ++i)
   {
      // assert that the pre-computed permutation was correct
      assert(perm[i] == perm_tmp[i]);

      // update the global index mapping
      if(perm[i] >= 0)
         m_rIdx[perm[i]] = m_rIdx[i];
   }

   spx_free(perm);
   spx_free(perm_tmp);

   if(remRows + remNzos > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate rows) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remRows > this->m_minReduction * oldRows)
         again = true;

   }

   return this->OKAY;
}